

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O1

bool __thiscall
BlockFilterIndex::Write
          (BlockFilterIndex *this,BlockFilter *filter,uint32_t block_height,uint256 *filter_header)

{
  uint *puVar1;
  DataStream *s;
  CDBWrapper *_parent;
  bool bVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  DBHeightKey local_104;
  CDBBatch local_100;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint256 local_88;
  uint256 local_68;
  FlatFilePos local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = WriteFilterToDisk(this,&this->m_next_filter_pos,filter);
  if (sVar3 == 0) {
    bVar2 = false;
  }
  else {
    local_68.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_68.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_88.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_48[0].nFile = -1;
    local_48[0].nPos = 0;
    local_a8 = *(undefined8 *)(filter->m_block_hash).super_base_blob<256U>.m_data._M_elems;
    uStack_a0 = *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 8);
    local_98 = *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 0x10);
    uStack_90 = *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 0x18)
    ;
    BlockFilter::GetHash(&local_88,filter);
    local_68.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(filter_header->super_base_blob<256U>).m_data._M_elems;
    local_68.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((filter_header->super_base_blob<256U>).m_data._M_elems + 8);
    local_68.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((filter_header->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_68.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((filter_header->super_base_blob<256U>).m_data._M_elems + 0x18);
    local_48[0] = this->m_next_filter_pos;
    _parent = &((this->m_db)._M_t.
                super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
                super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper;
    local_104.height = block_height;
    CDBBatch::CDBBatch(&local_100,_parent);
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
              (&local_100.ssKey.vch,local_100.ssKey.m_read_pos + 0x40);
    s = &local_100.ssValue;
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
              (&s->vch,local_100.ssValue.m_read_pos + 0x400);
    DataStream::operator<<(&local_100.ssKey,&local_104);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
               local_100.ssValue.vch.
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_a8,&local_88);
    SerializeMany<DataStream,uint256,uint256,FlatFilePos>(s,&local_88,&local_68,local_48);
    key.m_data = local_100.ssKey.vch.
                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start + local_100.ssKey.m_read_pos;
    key.m_size = (long)local_100.ssKey.vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)key.m_data;
    CDBBatch::WriteImpl(&local_100,key,s);
    if (local_100.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_100.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_100.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_100.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    local_100.ssKey.m_read_pos = 0;
    if (local_100.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_100.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_100.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_100.ssValue.vch.
           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_100.ssValue.m_read_pos = 0;
    bVar2 = CDBWrapper::WriteBatch(_parent,&local_100,false);
    CDBBatch::~CDBBatch(&local_100);
    if (bVar2) {
      puVar1 = &(this->m_next_filter_pos).nPos;
      *puVar1 = *puVar1 + (int)sVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::Write(const BlockFilter& filter, uint32_t block_height, const uint256& filter_header)
{
    size_t bytes_written = WriteFilterToDisk(m_next_filter_pos, filter);
    if (bytes_written == 0) return false;

    std::pair<uint256, DBVal> value;
    value.first = filter.GetBlockHash();
    value.second.hash = filter.GetHash();
    value.second.header = filter_header;
    value.second.pos = m_next_filter_pos;

    if (!m_db->Write(DBHeightKey(block_height), value)) {
        return false;
    }

    m_next_filter_pos.nPos += bytes_written;
    return true;
}